

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fits_pixel_filter(PixelFilter *filter,int *status)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint *in_RSI;
  long in_RDI;
  char *in_stack_00000028;
  char *parInfo;
  char *parName;
  DataInfo *varInfo;
  iteratorCol *colIter;
  int tstatus;
  long nullVal;
  char card [81];
  int keyclass;
  int more;
  int ncards;
  int i;
  char *type;
  ParseData lParse;
  int writeBlankKwd;
  char msg [256];
  char *DEFAULT_TAGS [1];
  fitsfile *outfptr;
  fitsfile *infptr;
  int datatype;
  Node *result;
  int col_cnt;
  long naxes [5];
  long nelem;
  int bitpix;
  int naxis;
  parseInfo Info;
  long *naxes_00;
  uint *status_00;
  ParseData *lParse_00;
  ParseData *lParse_01;
  uint *status_01;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  int in_stack_fffffffffffffc50;
  uint uVar4;
  fitsfile *in_stack_fffffffffffffc58;
  int *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc70;
  uint in_stack_fffffffffffffc78;
  fitsfile *in_stack_fffffffffffffc88;
  int *in_stack_fffffffffffffc98;
  iteratorCol *in_stack_fffffffffffffca0;
  DataInfo *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  int *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  ParseData *in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcd4;
  fitsfile *in_stack_fffffffffffffcd8;
  int local_318;
  uint local_314;
  int *in_stack_fffffffffffffcf0;
  fitsfile *in_stack_fffffffffffffcf8;
  ParseData *in_stack_fffffffffffffd00;
  _func_int_ParseData_ptr_int_long_long_void_ptr_char_ptr *in_stack_fffffffffffffd08;
  Node *local_2d0;
  int local_2c0;
  int local_2a8;
  iteratorCol *local_268;
  char local_218 [256];
  char *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined4 local_fc;
  Node *local_f8;
  undefined4 in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  _func_int_ParseData_ptr_char_ptr_void_ptr *in_stack_ffffffffffffff20;
  _func_int_ParseData_ptr_int_long_long_void_ptr_char_ptr *in_stack_ffffffffffffff28;
  iteratorCol *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  uint local_b8;
  uint in_stack_ffffffffffffff50;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff54;
  int local_90;
  
  memset(&stack0xffffffffffffff50,0,0x90);
  local_118 = "X";
  bVar1 = false;
  pcVar3 = getenv("DEBUG_PIXFILTER");
  DEBUG_PIXFILTER = (int)(pcVar3 != (char *)0x0);
  memset(&stack0xffffffffffffff50,0,0x90);
  if (*in_RSI != 0) {
    return *in_RSI;
  }
  if ((((*(long *)(in_RDI + 0x10) == 0) || (**(long **)(in_RDI + 0x10) == 0)) ||
      (*(char *)**(undefined8 **)(in_RDI + 0x10) == '\0')) &&
     (*(char ***)(in_RDI + 0x10) = &local_118, DEBUG_PIXFILTER != 0)) {
    printf("using default tag \'%s\'\n",**(undefined8 **)(in_RDI + 0x10));
  }
  local_108 = **(undefined8 **)(in_RDI + 0x18);
  local_110 = *(undefined8 *)(in_RDI + 0x38);
  lParse_00 = (ParseData *)&stack0xffffffffffffff18;
  naxes_00 = (long *)&stack0xffffffffffffff4c;
  lParse_01 = (ParseData *)&stack0xfffffffffffffcf8;
  status_01 = in_RSI;
  iVar2 = ffiprs(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                 (char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,
                 in_stack_fffffffffffffcb8,
                 (long *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffcf0,(long *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffd08);
  if (iVar2 != 0) goto LAB_00142ceb;
  uVar5 = in_stack_ffffffffffffff50;
  if (in_stack_ffffffffffffff50 == 1) {
LAB_001423e9:
    pcVar3 = "BIT";
    if (DEBUG_PIXFILTER != 0) {
      printf("hmm, image from bits?\n");
    }
  }
  else if (in_stack_ffffffffffffff50 == 0xe) {
    pcVar3 = "LOGICAL";
  }
  else {
    if (in_stack_ffffffffffffff50 == 0x10) {
      *in_RSI = 0xffffffff;
      ffpmsg((char *)0x1423e9);
      goto LAB_001423e9;
    }
    if (in_stack_ffffffffffffff50 == 0x29) {
      pcVar3 = "LONG";
    }
    else if (in_stack_ffffffffffffff50 == 0x52) {
      pcVar3 = "DOUBLE";
    }
    else {
      pcVar3 = "UNKNOWN?!";
      *in_RSI = 0xffffffff;
      ffpmsg((char *)0x14243a);
    }
  }
  if (DEBUG_PIXFILTER != 0) {
    printf("result type is %s [%d]\n",pcVar3,(ulong)uVar5);
  }
  if (*in_RSI == 0) {
    iVar2 = ffgipr((fitsfile *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (int)((ulong)status_01 >> 0x20),(int *)lParse_01,(int *)lParse_00,naxes_00,
                   (int *)0x1424a4);
    if (iVar2 == 0) {
      if (DEBUG_PIXFILTER != 0) {
        printf("input bitpix %d\n",(ulong)local_b8);
      }
      if ((uVar5 == 0x52) && (local_b8 != 0xffffffc0)) {
        local_b8 = 0xffffffe0;
      }
      if (*(int *)(in_RDI + 0x28) != 0) {
        local_b8 = *(uint *)(in_RDI + 0x28);
      }
      if (DEBUG_PIXFILTER != 0) {
        printf("output bitpix %d\n",(ulong)local_b8);
      }
      iVar2 = ffcrim(in_stack_fffffffffffffc58,in_stack_ffffffffffffff50,in_stack_fffffffffffffc50,
                     (long *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     (int *)status_01);
      if (iVar2 == 0) {
        iVar2 = ffghsp((fitsfile *)lParse_01,(int *)lParse_00,(int *)naxes_00,(int *)0x14259d);
        if (iVar2 == 0) {
          for (local_314 = 1; (int)local_314 <= local_318; local_314 = local_314 + 1) {
            iVar2 = ffgrec((fitsfile *)lParse_01,(int)((ulong)lParse_00 >> 0x20),(char *)naxes_00,
                           (int *)0x1425f3);
            if (iVar2 != 0) {
              snprintf(local_218,0x100,"pixel_filter: unable to read keycard %d",(ulong)local_314);
              ffpmsg((char *)0x142627);
              goto LAB_00142ceb;
            }
            iVar2 = ffgkcl(in_stack_00000028);
            if ((((iVar2 != 10) && ((iVar2 != 0x82 || (0xb < (int)local_314)))) &&
                ((iVar2 != 0x28 || (-1 < (int)local_b8)))) &&
               (((iVar2 != 0x1e || (-1 < (int)local_b8)) &&
                (iVar2 = ffprec((fitsfile *)in_stack_fffffffffffffca8,
                                (char *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98),
                iVar2 != 0)))) {
              snprintf(local_218,0x100,"pixel_filter: unable to write keycard \'%s\' [%d]\n",
                       &stack0xfffffffffffffc88,(ulong)*in_RSI);
              ffpmsg((char *)0x1426eb);
              goto LAB_00142ceb;
            }
          }
          if (local_b8 == 0xffffffc0) {
            local_fc = 0x52;
            uVar5 = 0x52;
          }
          else if (local_b8 == 0xffffffe0) {
            local_fc = 0x52;
            uVar5 = 0x2a;
          }
          else if (local_b8 == 8) {
            local_fc = 0x29;
            uVar5 = 0xb;
          }
          else if (local_b8 == 0x10) {
            local_fc = 0x29;
            uVar5 = 0x15;
          }
          else {
            if (local_b8 != 0x20) {
              snprintf(local_218,0x100,"pixel_filter: unexpected output bitpix %d\n",(ulong)local_b8
                      );
              ffpmsg((char *)0x1427ff);
              *in_RSI = 0xffffffff;
              goto LAB_00142ceb;
            }
            local_fc = 0x29;
            uVar5 = 0x29;
          }
          uVar4 = local_b8;
          if (0 < (int)local_b8) {
            pcVar3 = *(char **)(in_RDI + 0x30);
            if (*(long *)(in_RDI + 0x30) == 0) {
              iVar2 = ffgkyj(in_stack_fffffffffffffc88,pcVar3,
                             (long *)(ulong)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                             in_stack_fffffffffffffc68);
              if (iVar2 != 0) {
                bVar1 = true;
                if (local_b8 == 8) {
                  pcVar3 = (char *)0xff;
                }
                else if (local_b8 == 0x10) {
                  pcVar3 = (char *)0xffffffffffff8000;
                }
                else if (local_b8 == 0x20) {
                  pcVar3 = (char *)0xffffffff80000000;
                }
                else {
                  printf("unhandled positive output BITPIX %d\n",(ulong)local_b8);
                }
              }
              *(char **)(in_RDI + 0x30) = pcVar3;
            }
            ffpnul((fitsfile *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (LONGLONG)status_01,(int *)lParse_01);
            if (DEBUG_PIXFILTER != 0) {
              printf("using blank %ld\n",pcVar3);
            }
          }
          if (*(char *)(in_RDI + 0x40) == '\0') {
            iVar2 = fits_parser_allocateCol
                              (lParse_01,(int)((ulong)lParse_00 >> 0x20),(int *)naxes_00);
            if (iVar2 == 0) {
              local_268[local_2a8].fptr = *(fitsfile **)(in_RDI + 0x38);
              local_268[local_2a8].iotype = 2;
              set_image_col_types(in_stack_fffffffffffffcc8,
                                  (fitsfile *)
                                  CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                                  (char *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,
                                  in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
              status_00 = in_RSI;
              iVar2 = ffiter(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                             (long)in_stack_ffffffffffffff28,(long)in_stack_ffffffffffffff20,
                             (_func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *)
                             in_stack_ffffffffffffff18,
                             (void *)CONCAT44(local_2a8,in_stack_ffffffffffffff10),
                             (int *)CONCAT44(in_stack_ffffffffffffff54,uVar5));
              if (iVar2 == -1) {
                *in_RSI = 0;
              }
              else if (*in_RSI != 0) goto LAB_00142ceb;
              if (local_90 == 0) {
                if ((0 < (int)local_b8) &&
                   (iVar2 = ffpnul((fitsfile *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                   (LONGLONG)status_01,(int *)lParse_01), iVar2 != 0)) {
                  ffpmsg((char *)0x142b4d);
                }
              }
              else if (bVar1) {
                ffukyj((fitsfile *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                       (char *)status_01,(LONGLONG)lParse_01,(char *)lParse_00,(int *)status_00);
                if (*in_RSI != 0) {
                  ffpmsg((char *)0x142ae3);
                }
                if (DEBUG_PIXFILTER != 0) {
                  printf("output has NULLs\n");
                  printf("wrote blank [%d]\n",(ulong)*in_RSI);
                }
              }
            }
          }
          else {
            local_f8 = local_2d0 + local_2c0;
            if (uVar5 != 1) {
              if (uVar5 == 0xe) {
                ffukyl((fitsfile *)CONCAT44(0xe,in_stack_fffffffffffffc48),(char *)status_01,
                       (int)((ulong)lParse_01 >> 0x20),(char *)lParse_00,(int *)naxes_00);
                goto LAB_00142ceb;
              }
              if (uVar5 != 0x10) {
                if (uVar5 == 0x29) {
                  ffukyj((fitsfile *)CONCAT44(0x29,in_stack_fffffffffffffc48),(char *)status_01,
                         (LONGLONG)lParse_01,(char *)lParse_00,(int *)naxes_00);
                }
                else if (uVar5 == 0x52) {
                  ffukyd((fitsfile *)(in_RDI + 0x8b),
                         (char *)CONCAT44(in_stack_ffffffffffffff50,uVar4),
                         (double)CONCAT44(0x52,in_stack_fffffffffffffc48),
                         (int)((ulong)status_01 >> 0x20),(char *)lParse_01,(int *)lParse_00);
                }
                else {
                  snprintf(local_218,0x100,"pixel_filter: unexpected constant result type [%d]\n",
                           (ulong)uVar5);
                  ffpmsg((char *)0x142ce7);
                }
                goto LAB_00142ceb;
              }
            }
            ffukys((fitsfile *)CONCAT44(uVar5,in_stack_fffffffffffffc48),(char *)status_01,
                   (char *)lParse_01,(char *)lParse_00,(int *)naxes_00);
          }
        }
        else {
          ffpmsg((char *)0x1425ae);
        }
      }
      else {
        ffpmsg((char *)0x142573);
      }
    }
    else {
      ffpmsg((char *)0x1424b5);
    }
  }
LAB_00142ceb:
  ffcprs(lParse_00);
  return *in_RSI;
}

Assistant:

int fits_pixel_filter (PixelFilter * filter, int * status)
/* Evaluate an expression using the data in the input FITS file(s)          */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info = { 0 };
   int naxis, bitpix;
   long nelem, naxes[MAXDIMS];
   int col_cnt;
   Node *result;
   int datatype;
   fitsfile * infptr;
   fitsfile * outfptr;
   char * DEFAULT_TAGS[] = { "X" };
   char msg[256];
   int writeBlankKwd = 0;   /* write BLANK if any output nulls? */
   ParseData lParse;

   DEBUG_PIXFILTER = getenv("DEBUG_PIXFILTER") ? 1 : 0;

   memset(&Info, 0, sizeof(Info));   

   if (*status)
      return (*status);

   if (!filter->tag || !filter->tag[0] || !filter->tag[0][0]) {
      filter->tag = DEFAULT_TAGS;
      if (DEBUG_PIXFILTER)
         printf("using default tag '%s'\n", filter->tag[0]);
   }

   infptr = filter->ifptr[0];
   outfptr = filter->ofptr;
   lParse.pixFilter = filter;

   if (ffiprs(infptr, 0, filter->expression, MAXDIMS,
	      &Info.datatype, &nelem, &naxis, naxes, &lParse, status)) {
      goto CLEANUP;
   }


   if (nelem < 0) {
      nelem = -nelem;
   }

   {
      /* validate result type */
      const char * type = 0;
      switch (Info.datatype) {
         case TLOGICAL:  type = "LOGICAL"; break;
         case TLONG:     type = "LONG"; break;
         case TDOUBLE:   type = "DOUBLE"; break;
         case TSTRING:   type = "STRING";
                         *status = pERROR;
                         ffpmsg("pixel_filter: cannot have string image");
         case TBIT:      type = "BIT";
                         if (DEBUG_PIXFILTER)
                            printf("hmm, image from bits?\n");
                         break;
         default:       type = "UNKNOWN?!";
                        *status = pERROR;
                        ffpmsg("pixel_filter: unexpected result datatype");
      }
      if (DEBUG_PIXFILTER)
         printf("result type is %s [%d]\n", type, Info.datatype);
      if (*status)
         goto CLEANUP;
   }

   if (fits_get_img_param(infptr, MAXDIMS,
            &bitpix, &naxis, &naxes[0], status)) {
      ffpmsg("pixel_filter: unable to read input image parameters");
      goto CLEANUP;
   }

   if (DEBUG_PIXFILTER)
      printf("input bitpix %d\n", bitpix);

   if (Info.datatype == TDOUBLE) {
       /*  for floating point expressions, set the default output image to
           bitpix = -32 (float) unless the default is already a double */
       if (bitpix != DOUBLE_IMG)
           bitpix = FLOAT_IMG;
   }

   /* override output image bitpix if specified by caller */
   if (filter->bitpix)
      bitpix = filter->bitpix;
   if (DEBUG_PIXFILTER)
      printf("output bitpix %d\n", bitpix);

   if (fits_create_img(outfptr, bitpix, naxis, naxes, status)) {
      ffpmsg("pixel_filter: unable to create output image");
      goto CLEANUP;
   }

   /* transfer keycards */
   {
      int i, ncards, more;
      if (fits_get_hdrspace(infptr, &ncards, &more, status)) {
         ffpmsg("pixel_filter: unable to determine number of keycards");
         goto CLEANUP;
      }

      for (i = 1; i <= ncards; ++i) {

         int keyclass;
         char card[FLEN_CARD];

         if (fits_read_record(infptr, i, card, status)) {
            snprintf(msg, 256,"pixel_filter: unable to read keycard %d", i);
            ffpmsg(msg);
            goto CLEANUP;
         }

         keyclass = fits_get_keyclass(card);
         if (keyclass == TYP_STRUC_KEY) {
            /* output structure defined by fits_create_img */
         }
         else if (keyclass == TYP_COMM_KEY && i < 12) {
            /* assume this is one of the FITS standard comments */
         }
         else if (keyclass == TYP_NULL_KEY && bitpix < 0) {
            /* do not transfer BLANK to real output image */
         }
         else if (keyclass == TYP_SCAL_KEY && bitpix < 0) {
            /* do not transfer BZERO, BSCALE to real output image */
         }
         else if (fits_write_record(outfptr, card, status)) {
            snprintf(msg,256, "pixel_filter: unable to write keycard '%s' [%d]\n",
                        card, *status);
            ffpmsg(msg);
            goto CLEANUP;
         }
      }
   }

   switch (bitpix) {
      case BYTE_IMG: datatype = TLONG; Info.datatype = TBYTE; break;
      case SHORT_IMG: datatype = TLONG; Info.datatype = TSHORT; break;
      case LONG_IMG: datatype = TLONG; Info.datatype = TLONG; break;
      case FLOAT_IMG: datatype = TDOUBLE; Info.datatype = TFLOAT; break;
      case DOUBLE_IMG: datatype = TDOUBLE; Info.datatype = TDOUBLE; break;

      default:
           snprintf(msg, 256,"pixel_filter: unexpected output bitpix %d\n", bitpix);
           ffpmsg(msg);
           *status = pERROR;
           goto CLEANUP;
   }

   if (bitpix > 0) { /* arrange for NULLs in output */
      long nullVal = filter->blank;
      if (!filter->blank) {
         int tstatus = 0;
         if (fits_read_key_lng(infptr, "BLANK", &nullVal, 0, &tstatus)) {

            writeBlankKwd = 1;

            if (bitpix == BYTE_IMG)
                nullVal = UCHAR_MAX;
            else if (bitpix == SHORT_IMG)
                nullVal = SHRT_MIN;
            else if (bitpix == LONG_IMG) {
               if (sizeof(long) == 8 && sizeof(int) == 4)
                  nullVal = INT_MIN;
               else
                  nullVal = LONG_MIN;
            }
            else
                printf("unhandled positive output BITPIX %d\n", bitpix);
         }

         filter->blank = nullVal;
      }

      fits_set_imgnull(outfptr, filter->blank, status);
      if (DEBUG_PIXFILTER)
         printf("using blank %ld\n", nullVal);

   }

   if (!filter->keyword[0]) {
      iteratorCol * colIter;
      DataInfo * varInfo;

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/
      col_cnt = lParse.nCols;
      if (fits_parser_allocateCol(&lParse, col_cnt, status))
         goto CLEANUP;
      lParse.nCols++;

      colIter = &lParse.colData[col_cnt];
      colIter->fptr = filter->ofptr;
      colIter->iotype = OutputCol;
      varInfo = &lParse.varData[col_cnt];
      set_image_col_types(&lParse, colIter->fptr, "CREATED", bitpix, varInfo, colIter);

      Info.maxRows = -1;
      Info.parseData = &lParse;

      if (ffiter(lParse.nCols, lParse.colData, 0,
                     0, fits_parser_workfn, &Info, status) == -1)
            *status = 0;
      else if (*status)
         goto CLEANUP;

      if (Info.anyNull) {
         if (writeBlankKwd) {
            fits_update_key_lng(outfptr, "BLANK", filter->blank, "NULL pixel value", status);
            if (*status)
                ffpmsg("pixel_filter: unable to write BLANK keyword");
            if (DEBUG_PIXFILTER) {
                printf("output has NULLs\n");
                printf("wrote blank [%d]\n", *status);
            }
         }
      }
      else if (bitpix > 0) /* never used a null */
         if (fits_set_imgnull(outfptr, -1234554321, status))
            ffpmsg("pixel_filter: unable to reset imgnull");
   }
   else {

      /* Put constant result into keyword */
      char * parName = filter->keyword;
      char * parInfo = filter->comment;

      result  = lParse.Nodes + lParse.resultNode;
      switch (Info.datatype) {
      case TDOUBLE:
         ffukyd(outfptr, parName, result->value.data.dbl, 15, parInfo, status);
         break;
      case TLONG:
         ffukyj(outfptr, parName, result->value.data.lng, parInfo, status);
         break;
      case TLOGICAL:
         ffukyl(outfptr, parName, result->value.data.log, parInfo, status);
         break;
      case TBIT:
      case TSTRING:
         ffukys(outfptr, parName, result->value.data.str, parInfo, status);
         break;
      default:
         snprintf(msg, 256,"pixel_filter: unexpected constant result type [%d]\n",
                Info.datatype);
         ffpmsg(msg);
      }
   }

CLEANUP:
   ffcprs(&lParse);
   return (*status);
}